

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# equality.cpp
# Opt level: O1

void __thiscall
Equality_unitsEqualAllTestedConditionsVariant1_Test::
~Equality_unitsEqualAllTestedConditionsVariant1_Test
          (Equality_unitsEqualAllTestedConditionsVariant1_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Equality, unitsEqualAllTestedConditionsVariant1)
{
    libcellml::UnitsPtr u1 = libcellml::Units::create("unitsA");
    libcellml::UnitsPtr u2 = libcellml::Units::create("unitsA");

    libcellml::ImportSourcePtr is = libcellml::ImportSource::create();

    u1->setImportReference("some_location");
    u2->setImportReference("some_location");

    u1->setSourceUnits(is, "ampere");
    u2->setSourceUnits(is, "ampere");

    u1->addUnit("banana");
    u2->addUnit("banana");

    EXPECT_TRUE(u1->equals(u2));
    EXPECT_TRUE(u2->equals(u1));
}